

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O3

void __thiscall LSMTree::~LSMTree(LSMTree *this)

{
  MemTable *pMVar1;
  DiskTable *this_00;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (**(this->memory->
             super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )._vptr_Dictionary)();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    DiskTable::persistent(this->disk,this->memory,false);
  }
  pMVar1 = this->memory;
  if (pMVar1 != (MemTable *)0x0) {
    (pMVar1->
    super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    )._vptr_Dictionary = (_func_int **)&PTR_size_0010fc90;
    std::__cxx11::
    _List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::_M_clear
              (&(pMVar1->qlist).
                super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
              );
  }
  operator_delete(pMVar1,0x30);
  this_00 = this->disk;
  if (this_00 != (DiskTable *)0x0) {
    DiskTable::~DiskTable(this_00);
  }
  operator_delete(this_00,0x58);
  std::filesystem::__cxx11::path::~path(&this->data_home);
  return;
}

Assistant:

LSMTree::~LSMTree() {
    if (memory->size() != 0) {
        disk->persistent(std::move(*memory));
    }
    delete memory;
    delete disk;
}